

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbi_cache.cpp
# Opt level: O1

void __thiscall
icu_63::RuleBasedBreakIterator::DictionaryCache::populateDictionary
          (DictionaryCache *this,int32_t startPos,int32_t endPos,int32_t firstRuleStatus,
          int32_t otherRuleStatus)

{
  UText *ut;
  ushort uVar1;
  RuleBasedBreakIterator *pRVar2;
  UTrie2 *pUVar3;
  uint16_t *puVar4;
  int32_t *piVar5;
  UBool UVar6;
  uint c;
  int iVar7;
  int32_t iVar8;
  ushort *puVar9;
  int64_t iVar10;
  LanguageBreakEngine *pLVar11;
  long lVar12;
  int iVar13;
  ulong uVar14;
  UErrorCode status;
  UErrorCode local_4c;
  uint local_48;
  int local_44;
  UVector32 *local_40;
  int32_t *local_38;
  
  if (endPos - startPos < 2) {
    return;
  }
  this->fPositionInCache = -1;
  local_40 = &this->fBreaks;
  this->fStart = 0;
  this->fLimit = 0;
  this->fFirstRuleStatusIndex = 0;
  this->fOtherRuleStatusIndex = 0;
  UVector32::removeAllElements(local_40);
  this->fFirstRuleStatusIndex = firstRuleStatus;
  this->fOtherRuleStatusIndex = otherRuleStatus;
  local_4c = U_ZERO_ERROR;
  pRVar2 = this->fBI;
  ut = &pRVar2->fText;
  local_48 = startPos;
  utext_setNativeIndex_63(ut,(long)startPos);
  c = utext_current32_63(ut);
  pUVar3 = this->fBI->fData->fTrie;
  puVar4 = pUVar3->index;
  if (c < 0xd800) {
    uVar1 = puVar4[c >> 5];
  }
  else {
    if (c < 0x10000) {
      uVar14 = (ulong)((c >> 5) + 0x140);
      if (0xdbff < (int)c) {
        uVar14 = (ulong)(c >> 5);
      }
    }
    else {
      if (0x10ffff < c) {
        iVar13 = pUVar3->indexLength + 0x80;
        goto LAB_00322834;
      }
      if (pUVar3->highStart <= (int)c) {
        iVar13 = pUVar3->highValueIndex;
        goto LAB_00322834;
      }
      uVar14 = (ulong)((c >> 5 & 0x3f) + (uint)puVar4[(ulong)(c >> 0xb) + 0x820]);
    }
    uVar1 = puVar4[uVar14];
  }
  iVar13 = (c & 0x1f) + (uint)uVar1 * 4;
LAB_00322834:
  if (local_4c < U_ILLEGAL_ARGUMENT_ERROR) {
    local_38 = &this->fStart;
    puVar9 = puVar4 + iVar13;
    local_44 = 0;
    do {
      while( true ) {
        uVar1 = *puVar9;
        iVar13 = (pRVar2->fText).chunkOffset;
        if ((pRVar2->fText).nativeIndexingLimit < iVar13) {
          iVar10 = (*((pRVar2->fText).pFuncs)->mapOffsetToNative)(ut);
          iVar13 = (int)iVar10;
        }
        else {
          iVar13 = iVar13 + (int)(pRVar2->fText).chunkNativeStart;
        }
        if ((endPos <= iVar13) || ((uVar1 & 0x4000) != 0)) break;
        utext_next32_63(ut);
        c = utext_current32_63(ut);
        pUVar3 = this->fBI->fData->fTrie;
        puVar4 = pUVar3->index;
        if (c < 0xd800) {
          uVar1 = puVar4[c >> 5];
LAB_003228f2:
          iVar13 = (c & 0x1f) + (uint)uVar1 * 4;
        }
        else {
          if (c < 0x10000) {
            uVar14 = (ulong)((c >> 5) + 0x140);
            if (0xdbff < (int)c) {
              uVar14 = (ulong)(c >> 5);
            }
LAB_003228ee:
            uVar1 = puVar4[uVar14];
            goto LAB_003228f2;
          }
          if (c < 0x110000) {
            if ((int)c < pUVar3->highStart) {
              uVar14 = (ulong)((c >> 5 & 0x3f) + (uint)puVar4[(ulong)(c >> 0xb) + 0x820]);
              goto LAB_003228ee;
            }
            iVar13 = pUVar3->highValueIndex;
          }
          else {
            iVar13 = pUVar3->indexLength + 0x80;
          }
        }
        puVar9 = puVar4 + iVar13;
      }
      if (endPos <= iVar13) break;
      pLVar11 = getLanguageBreakEngine(this->fBI,c);
      if (pLVar11 != (LanguageBreakEngine *)0x0) {
        iVar13 = (*pLVar11->_vptr_LanguageBreakEngine[3])
                           (pLVar11,ut,(ulong)local_48,(ulong)(uint)endPos,local_40);
        local_44 = local_44 + iVar13;
      }
      c = utext_current32_63(ut);
      pUVar3 = this->fBI->fData->fTrie;
      puVar4 = pUVar3->index;
      if (c < 0xd800) {
        uVar1 = puVar4[c >> 5];
LAB_003229c6:
        iVar13 = (c & 0x1f) + (uint)uVar1 * 4;
      }
      else {
        if (c < 0x10000) {
          uVar14 = (ulong)((c >> 5) + 0x140);
          if (0xdbff < (int)c) {
            uVar14 = (ulong)(c >> 5);
          }
LAB_003229c2:
          uVar1 = puVar4[uVar14];
          goto LAB_003229c6;
        }
        if (c < 0x110000) {
          if ((int)c < pUVar3->highStart) {
            uVar14 = (ulong)((c >> 5 & 0x3f) + (uint)puVar4[(ulong)(c >> 0xb) + 0x820]);
            goto LAB_003229c2;
          }
          iVar13 = pUVar3->highValueIndex;
        }
        else {
          iVar13 = pUVar3->indexLength + 0x80;
        }
      }
      puVar9 = puVar4 + iVar13;
    } while (local_4c < U_ILLEGAL_ARGUMENT_ERROR);
    if (0 < local_44) {
      if ((this->fBreaks).count < 1) {
        iVar13 = 0;
      }
      else {
        iVar13 = *(this->fBreaks).elements;
      }
      if ((int)local_48 < iVar13) {
        UVector32::insertElementAt(local_40,local_48,0,&local_4c);
      }
      iVar13 = (this->fBreaks).count;
      if ((long)iVar13 < 1) {
        iVar7 = 0;
      }
      else {
        iVar7 = (this->fBreaks).elements[(long)iVar13 + -1];
      }
      if ((iVar7 < endPos) &&
         (((-2 < iVar13 && (iVar13 < (this->fBreaks).capacity)) ||
          (UVar6 = UVector32::expandCapacity(local_40,iVar13 + 1,&local_4c), UVar6 != '\0')))) {
        (this->fBreaks).elements[(this->fBreaks).count] = endPos;
        piVar5 = &(this->fBreaks).count;
        *piVar5 = *piVar5 + 1;
      }
      this->fPositionInCache = 0;
      lVar12 = (long)(this->fBreaks).count;
      if (lVar12 < 1) {
        *local_38 = 0;
        iVar8 = 0;
      }
      else {
        piVar5 = (this->fBreaks).elements;
        this->fStart = *piVar5;
        iVar8 = piVar5[lVar12 + -1];
      }
      this->fLimit = iVar8;
    }
  }
  return;
}

Assistant:

void RuleBasedBreakIterator::DictionaryCache::populateDictionary(int32_t startPos, int32_t endPos,
                                       int32_t firstRuleStatus, int32_t otherRuleStatus) {
    if ((endPos - startPos) <= 1) {
        return;
    }

    reset();
    fFirstRuleStatusIndex = firstRuleStatus;
    fOtherRuleStatusIndex = otherRuleStatus;

    int32_t rangeStart = startPos;
    int32_t rangeEnd = endPos;

    uint16_t    category;
    int32_t     current;
    UErrorCode  status = U_ZERO_ERROR;
    int32_t     foundBreakCount = 0;
    UText      *text = &fBI->fText;

    // Loop through the text, looking for ranges of dictionary characters.
    // For each span, find the appropriate break engine, and ask it to find
    // any breaks within the span.

    utext_setNativeIndex(text, rangeStart);
    UChar32     c = utext_current32(text);
    category = UTRIE2_GET16(fBI->fData->fTrie, c);

    while(U_SUCCESS(status)) {
        while((current = (int32_t)UTEXT_GETNATIVEINDEX(text)) < rangeEnd && (category & 0x4000) == 0) {
            utext_next32(text);           // TODO: cleaner loop structure.
            c = utext_current32(text);
            category = UTRIE2_GET16(fBI->fData->fTrie, c);
        }
        if (current >= rangeEnd) {
            break;
        }

        // We now have a dictionary character. Get the appropriate language object
        // to deal with it.
        const LanguageBreakEngine *lbe = fBI->getLanguageBreakEngine(c);

        // Ask the language object if there are any breaks. It will add them to the cache and
        // leave the text pointer on the other side of its range, ready to search for the next one.
        if (lbe != NULL) {
            foundBreakCount += lbe->findBreaks(text, rangeStart, rangeEnd, fBreaks);
        }

        // Reload the loop variables for the next go-round
        c = utext_current32(text);
        category = UTRIE2_GET16(fBI->fData->fTrie, c);
    }

    // If we found breaks, ensure that the first and last entries are
    // the original starting and ending position. And initialize the
    // cache iteration position to the first entry.

    // printf("foundBreakCount = %d\n", foundBreakCount);
    if (foundBreakCount > 0) {
        U_ASSERT(foundBreakCount == fBreaks.size());
        if (startPos < fBreaks.elementAti(0)) {
            // The dictionary did not place a boundary at the start of the segment of text.
            // Add one now. This should not commonly happen, but it would be easy for interactions
            // of the rules for dictionary segments and the break engine implementations to
            // inadvertently cause it. Cover it here, just in case.
            fBreaks.insertElementAt(startPos, 0, status);
        }
        if (endPos > fBreaks.peeki()) {
            fBreaks.push(endPos, status);
        }
        fPositionInCache = 0;
        // Note: Dictionary matching may extend beyond the original limit.
        fStart = fBreaks.elementAti(0);
        fLimit = fBreaks.peeki();
    } else {
        // there were no language-based breaks, even though the segment contained
        // dictionary characters. Subsequent attempts to fetch boundaries from the dictionary cache
        // for this range will fail, and the calling code will fall back to the rule based boundaries.
    }
}